

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

p_ply_element_conflict ply_grow_element(p_ply ply)

{
  p_ply_element_conflict element;
  p_ply ply_local;
  
  if (ply == (p_ply)0x0) {
    __assert_fail("ply",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x495,"p_ply_element ply_grow_element(p_ply)");
  }
  if ((ply->element == (p_ply_element_conflict)0x0) && (ply->nelements != 0)) {
    __assert_fail("ply->element || ply->nelements == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x496,"p_ply_element ply_grow_element(p_ply)");
  }
  if ((ply->element != (p_ply_element_conflict)0x0) && (ply->nelements < 1)) {
    __assert_fail("!ply->element || ply->nelements > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x497,"p_ply_element ply_grow_element(p_ply)");
  }
  ply_local = (p_ply)ply_grow_array(ply,&ply->element,&ply->nelements,0x118);
  if (ply_local == (p_ply)0x0) {
    ply_local = (p_ply)0x0;
  }
  else {
    ply_element_init((p_ply_element_conflict)ply_local);
  }
  return (p_ply_element_conflict)ply_local;
}

Assistant:

static p_ply_element ply_grow_element(p_ply ply) {
    p_ply_element element = NULL;
    assert(ply);
    assert(ply->element || ply->nelements == 0);
    assert(!ply->element || ply->nelements > 0);
    element = (p_ply_element) ply_grow_array(ply, (void **) &ply->element,
            &ply->nelements, sizeof(t_ply_element));
    if (!element) return NULL;
    ply_element_init(element);
    return element;
}